

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O3

void gost2012_hash_block(gost2012_hash_ctx *CTX,uchar *data,size_t len)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long_long uVar4;
  unsigned_long_long uVar5;
  unsigned_long_long uVar6;
  unsigned_long_long uVar7;
  unsigned_long_long uVar8;
  unsigned_long_long uVar9;
  unsigned_long_long uVar10;
  uint i;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  bool bVar14;
  
  sVar12 = CTX->bufsize;
  if (0x3f < len && sVar12 == 0) {
    do {
      uVar4 = *(unsigned_long_long *)data;
      uVar5 = *(unsigned_long_long *)((long)data + 8);
      uVar6 = *(unsigned_long_long *)((long)data + 0x10);
      uVar7 = *(unsigned_long_long *)((long)data + 0x18);
      uVar8 = *(unsigned_long_long *)((long)data + 0x20);
      uVar9 = *(unsigned_long_long *)((long)data + 0x28);
      uVar10 = *(unsigned_long_long *)((long)data + 0x38);
      (CTX->buffer).QWORD[6] = *(unsigned_long_long *)((long)data + 0x30);
      (CTX->buffer).QWORD[7] = uVar10;
      (CTX->buffer).QWORD[4] = uVar8;
      (CTX->buffer).QWORD[5] = uVar9;
      (CTX->buffer).QWORD[2] = uVar6;
      (CTX->buffer).QWORD[3] = uVar7;
      (CTX->buffer).QWORD[0] = uVar4;
      (CTX->buffer).QWORD[1] = uVar5;
      g(&CTX->h,&CTX->N,&CTX->buffer);
      lVar11 = 0;
      bVar14 = false;
      do {
        puVar1 = (ulong *)((long)&CTX->N + lVar11);
        uVar13 = (ulong)bVar14;
        uVar2 = *puVar1 + *(ulong *)((long)&buffer512 + lVar11);
        bVar14 = CARRY8(*puVar1,*(ulong *)((long)&buffer512 + lVar11)) || CARRY8(uVar2,uVar13);
        *puVar1 = uVar2 + uVar13;
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0x40);
      lVar11 = 0;
      bVar14 = false;
      do {
        puVar1 = (ulong *)((long)&CTX->Sigma + lVar11 * 8);
        uVar13 = (ulong)bVar14;
        uVar2 = *puVar1 + (CTX->buffer).QWORD[lVar11];
        bVar14 = CARRY8(*puVar1,(CTX->buffer).QWORD[lVar11]) || CARRY8(uVar2,uVar13);
        *puVar1 = uVar2 + uVar13;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      data = (uchar *)((long)data + 0x40);
      len = len - 0x40;
    } while (0x3f < len);
  }
  if (len != 0) {
    do {
      uVar13 = 0x40 - sVar12;
      if (len <= 0x40 - sVar12) {
        uVar13 = len;
      }
      memcpy((void *)((long)&CTX->buffer + sVar12),data,uVar13);
      sVar12 = sVar12 + uVar13;
      if (sVar12 == 0x40) {
        g(&CTX->h,&CTX->N,&CTX->buffer);
        lVar11 = 0;
        bVar14 = false;
        do {
          puVar1 = (ulong *)((long)&CTX->N + lVar11);
          uVar2 = (ulong)bVar14;
          uVar3 = *puVar1 + *(ulong *)((long)&buffer512 + lVar11);
          bVar14 = CARRY8(*puVar1,*(ulong *)((long)&buffer512 + lVar11)) || CARRY8(uVar3,uVar2);
          *puVar1 = uVar3 + uVar2;
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0x40);
        lVar11 = 0;
        bVar14 = false;
        do {
          puVar1 = (ulong *)((long)&CTX->Sigma + lVar11 * 8);
          uVar2 = (ulong)bVar14;
          uVar3 = *puVar1 + (CTX->buffer).QWORD[lVar11];
          bVar14 = CARRY8(*puVar1,(CTX->buffer).QWORD[lVar11]) || CARRY8(uVar3,uVar2);
          *puVar1 = uVar3 + uVar2;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        sVar12 = 0;
      }
      len = len - uVar13;
      data = (uchar *)((long)data + uVar13);
    } while (len != 0);
  }
  CTX->bufsize = sVar12;
  return;
}

Assistant:

void gost2012_hash_block(gost2012_hash_ctx * CTX,
                         const unsigned char *data, size_t len)
{
    register size_t bufsize = CTX->bufsize;

    if (bufsize == 0) {
        while (len >= 64) {
            memcpy(&CTX->buffer.B[0], data, 64);
            stage2(CTX, &(CTX->buffer));
            data += 64;
            len -= 64;
        }
    }

    while (len) {
        register size_t chunksize = 64 - bufsize;
        if (chunksize > len)
            chunksize = len;

        memcpy(&CTX->buffer.B[bufsize], data, chunksize);

        bufsize += chunksize;
        len -= chunksize;
        data += chunksize;

        if (bufsize == 64) {
            stage2(CTX, &(CTX->buffer) );
            bufsize = 0;
        }
    }
    CTX->bufsize = bufsize;
}